

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.h
# Opt level: O0

Form icu_63::number::impl::utils::getStandardPlural(PluralRules *rules,IFixedDecimal *fdec)

{
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  undefined1 local_60 [8];
  UnicodeString ruleString;
  IFixedDecimal *fdec_local;
  PluralRules *rules_local;
  
  if (rules == (PluralRules *)0x0) {
    rules_local._4_4_ = OTHER;
  }
  else {
    ruleString.fUnion._48_8_ = fdec;
    PluralRules::select((PluralRules *)local_60,(int)rules,(fd_set *)fdec,in_RCX,in_R8,in_R9);
    rules_local._4_4_ = StandardPlural::orOtherFromString((UnicodeString *)local_60);
    UnicodeString::~UnicodeString((UnicodeString *)local_60);
  }
  return rules_local._4_4_;
}

Assistant:

inline StandardPlural::Form getStandardPlural(const PluralRules *rules,
                                              const IFixedDecimal &fdec) {
    if (rules == nullptr) {
        // Fail gracefully if the user didn't provide a PluralRules
        return StandardPlural::Form::OTHER;
    } else {
        UnicodeString ruleString = rules->select(fdec);
        return StandardPlural::orOtherFromString(ruleString);
    }
}